

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzd_additional.c
# Opt level: O3

void mzd_mul_v_parity_uint64_192_30(mzd_local_t *c,mzd_local_t *v,mzd_local_t *At)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  byte bVar4;
  bool bVar5;
  ulong uVar6;
  long lVar7;
  long unaff_R12;
  long unaff_R13;
  undefined1 auVar8 [32];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar24 [64];
  undefined1 auVar23 [64];
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = v->w64[0];
  auVar9 = vpbroadcastq_avx512f(auVar1);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = v->w64[1];
  auVar10 = vpbroadcastq_avx512f(auVar2);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = v->w64[2];
  auVar11 = vpbroadcastq_avx512f(auVar3);
  auVar12 = vpmovsxbq_avx512f(ZEXT816(0x1718191a1b1c1d1e));
  auVar13 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
  auVar14 = vpbroadcastq_avx512f(ZEXT816(0x1e));
  auVar15 = vpbroadcastq_avx512f(ZEXT816(1));
  auVar16 = vpbroadcastq_avx512f(ZEXT816(0x40));
  auVar17 = vpbroadcastq_avx512f(ZEXT816(0xfffffffffffffff8));
  auVar24 = ZEXT1664((undefined1  [16])0x0);
  auVar18 = vpbroadcastq_avx512f();
  lVar7 = 0;
  do {
    auVar19 = vpbroadcastq_avx512f();
    auVar20 = vmovdqa64_avx512f(auVar24);
    auVar24 = vpsubq_avx512f(auVar14,auVar12);
    lVar7 = lVar7 + 8;
    auVar19 = vporq_avx512f(auVar19,auVar13);
    auVar24 = vpsllq_avx512f(auVar24,5);
    uVar6 = vpcmpuq_avx512f(auVar19,auVar14,1);
    vpaddq_avx512f(auVar18,auVar24);
    auVar24 = vpgatherqq_avx512f(*(undefined8 *)((long)At->w64 + unaff_R12));
    bVar4 = (byte)uVar6;
    auVar22._8_8_ = (ulong)((byte)(uVar6 >> 1) & 1) * auVar24._8_8_;
    auVar22._0_8_ = (ulong)(bVar4 & 1) * auVar24._0_8_;
    auVar22._16_8_ = (ulong)((byte)(uVar6 >> 2) & 1) * auVar24._16_8_;
    auVar22._24_8_ = (ulong)((byte)(uVar6 >> 3) & 1) * auVar24._24_8_;
    auVar22._32_8_ = (ulong)((byte)(uVar6 >> 4) & 1) * auVar24._32_8_;
    auVar22._40_8_ = (ulong)((byte)(uVar6 >> 5) & 1) * auVar24._40_8_;
    auVar22._48_8_ = (ulong)((byte)(uVar6 >> 6) & 1) * auVar24._48_8_;
    auVar22._56_8_ = (uVar6 >> 7) * auVar24._56_8_;
    auVar24 = vpgatherqq_avx512f(*(undefined8 *)(unaff_R13 + 8));
    auVar21._8_8_ = (ulong)((byte)(uVar6 >> 1) & 1) * auVar24._8_8_;
    auVar21._0_8_ = (ulong)(bVar4 & 1) * auVar24._0_8_;
    auVar21._16_8_ = (ulong)((byte)(uVar6 >> 2) & 1) * auVar24._16_8_;
    auVar21._24_8_ = (ulong)((byte)(uVar6 >> 3) & 1) * auVar24._24_8_;
    auVar21._32_8_ = (ulong)((byte)(uVar6 >> 4) & 1) * auVar24._32_8_;
    auVar21._40_8_ = (ulong)((byte)(uVar6 >> 5) & 1) * auVar24._40_8_;
    auVar21._48_8_ = (ulong)((byte)(uVar6 >> 6) & 1) * auVar24._48_8_;
    auVar21._56_8_ = (uVar6 >> 7) * auVar24._56_8_;
    auVar24 = vpandq_avx512f(auVar21,auVar10);
    auVar24 = vpternlogq_avx512f(auVar24,auVar22,auVar9,0x78);
    auVar22 = vpgatherqq_avx512f(*(undefined8 *)(unaff_R13 + 0x10));
    auVar23._8_8_ = (ulong)((byte)(uVar6 >> 1) & 1) * auVar22._8_8_;
    auVar23._0_8_ = (ulong)(bVar4 & 1) * auVar22._0_8_;
    auVar23._16_8_ = (ulong)((byte)(uVar6 >> 2) & 1) * auVar22._16_8_;
    auVar23._24_8_ = (ulong)((byte)(uVar6 >> 3) & 1) * auVar22._24_8_;
    auVar23._32_8_ = (ulong)((byte)(uVar6 >> 4) & 1) * auVar22._32_8_;
    auVar23._40_8_ = (ulong)((byte)(uVar6 >> 5) & 1) * auVar22._40_8_;
    auVar23._48_8_ = (ulong)((byte)(uVar6 >> 6) & 1) * auVar22._48_8_;
    auVar23._56_8_ = (uVar6 >> 7) * auVar22._56_8_;
    auVar22 = vpsubq_avx512f(auVar16,auVar12);
    auVar12 = vpaddq_avx512f(auVar12,auVar17);
    auVar24 = vpternlogq_avx512f(auVar23,auVar24,auVar11,0x6c);
    auVar24 = vpopcntq_avx512_vpopcntdq(auVar24);
    auVar24 = vpandq_avx512f(auVar24,auVar15);
    auVar24 = vpsllvq_avx512f(auVar24,auVar22);
    auVar24 = vporq_avx512f(auVar24,auVar20);
  } while (lVar7 != 0x20);
  auVar9._8_8_ = 0x1e;
  auVar9._0_8_ = 0x1e;
  auVar9._16_8_ = 0x1e;
  auVar9._24_8_ = 0x1e;
  auVar9._32_8_ = 0x1e;
  auVar9._40_8_ = 0x1e;
  auVar9._48_8_ = 0x1e;
  auVar9._56_8_ = 0x1e;
  uVar6 = vpcmpuq_avx512f(auVar19,auVar9,1);
  auVar9 = vmovdqa64_avx512f(auVar24);
  bVar5 = (bool)((byte)uVar6 & 1);
  auVar10._0_8_ = (ulong)bVar5 * auVar9._0_8_ | (ulong)!bVar5 * auVar20._0_8_;
  bVar5 = (bool)((byte)(uVar6 >> 1) & 1);
  auVar10._8_8_ = (ulong)bVar5 * auVar9._8_8_ | (ulong)!bVar5 * auVar20._8_8_;
  bVar5 = (bool)((byte)(uVar6 >> 2) & 1);
  auVar10._16_8_ = (ulong)bVar5 * auVar9._16_8_ | (ulong)!bVar5 * auVar20._16_8_;
  bVar5 = (bool)((byte)(uVar6 >> 3) & 1);
  auVar10._24_8_ = (ulong)bVar5 * auVar9._24_8_ | (ulong)!bVar5 * auVar20._24_8_;
  bVar5 = (bool)((byte)(uVar6 >> 4) & 1);
  auVar10._32_8_ = (ulong)bVar5 * auVar9._32_8_ | (ulong)!bVar5 * auVar20._32_8_;
  bVar5 = (bool)((byte)(uVar6 >> 5) & 1);
  auVar10._40_8_ = (ulong)bVar5 * auVar9._40_8_ | (ulong)!bVar5 * auVar20._40_8_;
  bVar5 = (bool)((byte)(uVar6 >> 6) & 1);
  auVar10._48_8_ = (ulong)bVar5 * auVar9._48_8_ | (ulong)!bVar5 * auVar20._48_8_;
  auVar10._56_8_ = (uVar6 >> 7) * auVar9._56_8_ | (ulong)!SUB81(uVar6 >> 7,0) * auVar20._56_8_;
  auVar8 = vextracti64x4_avx512f(auVar10,1);
  auVar9 = vporq_avx512f(auVar10,ZEXT3264(auVar8));
  auVar1 = vpor_avx(auVar9._0_16_,auVar9._16_16_);
  auVar2 = vpshufd_avx(auVar1,0xee);
  auVar1 = vpor_avx(auVar1,auVar2);
  c->w64[0] = 0;
  c->w64[1] = 0;
  c->w64[2] = auVar1._0_8_;
  return;
}

Assistant:

void mzd_mul_v_parity_uint64_192_30(mzd_local_t* c, mzd_local_t const* v, mzd_local_t const* At) {
  block_t* cblock       = BLOCK(c, 0);
  const block_t* vblock = CONST_BLOCK(v, 0);

  word res = 0;
  for (unsigned int i = 30; i; --i) {
    const block_t* Ablock = CONST_BLOCK(At, 30 - i);
    const word parity =
        parity64_uint64((vblock->w64[0] & Ablock->w64[0]) ^ (vblock->w64[1] & Ablock->w64[1]) ^
                        (vblock->w64[2] & Ablock->w64[2]));
    res |= parity << (64 - i);
  }
  for (unsigned int j = 0; j < 2; j++) {
    cblock->w64[j] = 0;
  }
  cblock->w64[2] = res;
}